

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

_Bool al_color_html_to_rgb(char *string,float *red,float *green,float *blue)

{
  int iVar1;
  size_t sVar2;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  char *in_RDI;
  int ib;
  int ig;
  int ir;
  char *ptr;
  int local_3c;
  int local_38;
  int local_34;
  char *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  _Bool local_1;
  
  *in_RCX = 0.0;
  *in_RDX = 0.0;
  *in_RSI = 0.0;
  local_30 = in_RDI;
  if (*in_RDI == '#') {
    local_30 = in_RDI + 1;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar2 = strlen(local_30);
  if (sVar2 == 6) {
    iVar1 = __isoc99_sscanf(local_30,"%02x%02x%02x",&local_34,&local_38,&local_3c);
    if (iVar1 == 3) {
      *local_18 = (float)local_34 / 255.0;
      *local_20 = (float)local_38 / 255.0;
      *local_28 = (float)local_3c / 255.0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_color_html_to_rgb(char const *string,
   float *red, float *green, float *blue)
{
   char const *ptr = string;
   int ir, ig, ib;
   ASSERT(ptr);
   ASSERT(red);
   ASSERT(green);
   ASSERT(blue);

   *red = *green = *blue = 0.0f;

   if (*ptr == '#')
      ptr++;

   if (strlen(ptr) != 6)
      return false;

   if (sscanf(ptr, "%02x%02x%02x", &ir, &ig, &ib) != 3)
      return false;

   *red = ir / 255.0;
   *green = ig / 255.0;
   *blue = ib / 255.0;
   return true;
}